

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<char16_t>::ClearCompactChar(CharSet<char16_t> *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  
  sVar4 = (this->rep).compact.countPlusOne;
  if (4 < sVar4 - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x1ef,"(IsCompact())","IsCompact()");
    if (!bVar2) goto LAB_00e5f673;
    *puVar3 = 0;
    sVar4 = (this->rep).compact.countPlusOne;
  }
  if ((int)sVar4 - 1U <= index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x210,"(index < this->GetCompactLength())",
                       "index < this->GetCompactLength()");
    if (!bVar2) goto LAB_00e5f673;
    *puVar3 = 0;
    sVar4 = (this->rep).compact.countPlusOne;
  }
  if (4 < sVar4 - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x211,"(IsCompact())","IsCompact()");
    if (!bVar2) {
LAB_00e5f673:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *(undefined4 *)((long)&this->rep + (ulong)index * 4 + 8) = 0xffffffff;
  return;
}

Assistant:

inline void ClearCompactChar(uint index)
        {
            Assert(index < this->GetCompactLength());
            Assert(IsCompact());
            rep.compact.cs[index] = emptySlot;
        }